

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

void __thiscall ncnn::Layer_final::get_layer_properties(Layer_final *this)

{
  Layer_final *this_local;
  
  (this->super_Layer).one_blob_only = (bool)(this->layer_cpu->one_blob_only & 1);
  (this->super_Layer).support_inplace = (bool)(this->layer_cpu->support_inplace & 1);
  (this->super_Layer).support_packing = (bool)(this->layer_cpu->support_packing & 1);
  (this->super_Layer).support_bf16_storage = (bool)(this->layer_cpu->support_bf16_storage & 1);
  (this->super_Layer).support_fp16_storage = (bool)(this->layer_cpu->support_fp16_storage & 1);
  (this->super_Layer).support_int8_storage = (bool)(this->layer_cpu->support_int8_storage & 1);
  (this->super_Layer).support_vulkan = false;
  (this->super_Layer).support_image_storage = false;
  (this->super_Layer).support_tensor_storage = false;
  return;
}

Assistant:

void get_layer_properties()
    {
        one_blob_only = layer_cpu->one_blob_only;
        support_inplace = layer_cpu->support_inplace;
        support_packing = layer_cpu->support_packing;
        support_bf16_storage = layer_cpu->support_bf16_storage;
        support_fp16_storage = layer_cpu->support_fp16_storage;
        support_int8_storage = layer_cpu->support_int8_storage;

        support_vulkan = 0;
        support_image_storage = 0;
        support_tensor_storage = 0;

#if NCNN_VULKAN
        if (layer_vulkan)
        {
            support_vulkan = layer_vulkan->support_vulkan;
            support_image_storage = layer_vulkan->support_image_storage;
            support_tensor_storage = layer_vulkan->support_tensor_storage;
        }
#endif
    }